

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall sglr::rc::TextureCubeArray::updateView(TextureCubeArray *this,DepthStencilMode mode)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int numLevels;
  TextureCubeArrayView local_38;
  
  uVar5 = (this->super_Texture).m_baseLevel;
  uVar6 = (ulong)uVar5;
  if ((uVar6 < 0xe) && ((this->m_levels).m_data[uVar6].m_cap != 0)) {
    bVar3 = isEmpty(&(this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess);
    if (!bVar3) {
      if ((this->super_Texture).m_sampler.minFilter < NEAREST_MIPMAP_NEAREST) {
        numLevels = 1;
      }
      else {
        uVar1 = (this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[0];
        uVar2 = (this->m_levels).m_access[uVar6].super_ConstPixelBufferAccess.m_size.m_data[1];
        iVar4 = ((this->super_Texture).m_maxLevel - uVar5) + 1;
        if ((int)uVar2 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar5 = 0x20;
        if (uVar2 != 0) {
          uVar5 = 0x1f;
          if (uVar2 != 0) {
            for (; uVar2 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        numLevels = 0x20 - uVar5;
        if (iVar4 < (int)(0x20 - uVar5)) {
          numLevels = iVar4;
        }
      }
      TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
      tcu::TextureCubeArrayView::TextureCubeArrayView
                (&local_38,numLevels,(this->m_levels).m_effectiveAccess + uVar6);
      goto LAB_008834d6;
    }
  }
  tcu::TextureCubeArrayView::TextureCubeArrayView(&local_38,0,(ConstPixelBufferAccess *)0x0);
LAB_008834d6:
  (this->m_view).m_numLevels = local_38.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_38._4_4_;
  *(undefined4 *)&(this->m_view).m_levels = local_38.m_levels._0_4_;
  *(undefined4 *)((long)&(this->m_view).m_levels + 4) = local_38.m_levels._4_4_;
  return;
}

Assistant:

void TextureCubeArray::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels2D(width, height)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::TextureCubeArrayView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::TextureCubeArrayView(0, DE_NULL);
}